

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O0

void ImGui_ImplGlfw_NewFrame(void)

{
  bool bVar1;
  double dVar2;
  float local_40;
  double current_time;
  ImVec2 local_28;
  int local_20;
  int local_1c;
  int display_h;
  int display_w;
  int h;
  int w;
  ImGuiIO *io;
  
  _h = ImGui::GetIO();
  bVar1 = ImFontAtlas::IsBuilt(_h->Fonts);
  if (!bVar1) {
    __assert_fail("io.Fonts->IsBuilt() && \"Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/Terrain/imgui_impl.cpp"
                  ,0x144,"void ImGui_ImplGlfw_NewFrame()");
  }
  glfwGetWindowSize(g_Window,&display_w,&display_h);
  glfwGetFramebufferSize(g_Window,&local_1c,&local_20);
  ImVec2::ImVec2(&local_28,(float)display_w,(float)display_h);
  _h->DisplaySize = local_28;
  if ((0 < display_w) && (0 < display_h)) {
    ImVec2::ImVec2((ImVec2 *)&current_time,(float)local_1c / (float)display_w,
                   (float)local_20 / (float)display_h);
    _h->DisplayFramebufferScale = (ImVec2)current_time;
  }
  dVar2 = glfwGetTime();
  if (g_Time <= 0.0) {
    local_40 = 0.016666668;
  }
  else {
    local_40 = (float)(dVar2 - g_Time);
  }
  _h->DeltaTime = local_40;
  g_Time = dVar2;
  ImGui_ImplGlfw_UpdateMousePosAndButtons();
  ImGui_ImplGlfw_UpdateMouseCursor();
  ImGui_ImplGlfw_UpdateGamepads();
  return;
}

Assistant:

void ImGui_ImplGlfw_NewFrame()
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    glfwGetWindowSize(g_Window, &w, &h);
    glfwGetFramebufferSize(g_Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / w, (float)display_h / h);

    // Setup time step
    double current_time = glfwGetTime();
    io.DeltaTime = g_Time > 0.0 ? (float)(current_time - g_Time) : (float)(1.0f/60.0f);
    g_Time = current_time;

    ImGui_ImplGlfw_UpdateMousePosAndButtons();
    ImGui_ImplGlfw_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplGlfw_UpdateGamepads();
}